

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmELF.cxx
# Opt level: O2

void __thiscall
cmELFInternalImpl<cmELFTypes64>::cmELFInternalImpl
          (cmELFInternalImpl<cmELFTypes64> *this,cmELF *external,
          unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
          *fin,ByteOrderType order)

{
  ushort uVar1;
  int iVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  ostream *poVar6;
  uint i;
  char *msg;
  FileType FVar7;
  _Head_base<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_false> local_1c0;
  char *local_1b8 [4];
  ostringstream e;
  
  local_1c0._M_head_impl =
       (fin->_M_t).
       super___uniq_ptr_impl<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
       .super__Head_base<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_false>.
       _M_head_impl;
  (fin->_M_t).
  super___uniq_ptr_impl<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
  .super__Head_base<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_false>._M_head_impl =
       (basic_istream<char,_std::char_traits<char>_> *)0x0;
  cmELFInternal::cmELFInternal
            (&this->super_cmELFInternal,external,
             (unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
              *)&local_1c0,order);
  if (local_1c0._M_head_impl != (basic_istream<char,_std::char_traits<char>_> *)0x0) {
    (*(local_1c0._M_head_impl)->_vptr_basic_istream[1])();
  }
  local_1c0._M_head_impl = (basic_istream<char,_std::char_traits<char>_> *)0x0;
  (this->super_cmELFInternal)._vptr_cmELFInternal = (_func_int **)&PTR__cmELFInternalImpl_00aa5280;
  (this->SectionHeaders).super__Vector_base<Elf64_Shdr,_std::allocator<Elf64_Shdr>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->SectionHeaders).super__Vector_base<Elf64_Shdr,_std::allocator<Elf64_Shdr>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->SectionHeaders).super__Vector_base<Elf64_Shdr,_std::allocator<Elf64_Shdr>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->DynamicSectionEntries).super__Vector_base<Elf64_Dyn,_std::allocator<Elf64_Dyn>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->DynamicSectionEntries).super__Vector_base<Elf64_Dyn,_std::allocator<Elf64_Dyn>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->DynamicSectionEntries).super__Vector_base<Elf64_Dyn,_std::allocator<Elf64_Dyn>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar3 = Read(this,&this->ELFHeader);
  if (bVar3) {
    uVar1 = (this->ELFHeader).e_type;
    FVar7 = (FileType)uVar1;
    switch(uVar1) {
    case 0:
      msg = "ELF file type is NONE.";
      goto LAB_0048c723;
    case 1:
      break;
    case 2:
      FVar7 = FileTypeExecutable;
      break;
    case 3:
      FVar7 = FileTypeSharedLibrary;
      break;
    case 4:
      FVar7 = FileTypeCore;
      break;
    default:
      if ((uVar1 & 0xff00) == 0xfe00) {
        FVar7 = FileTypeSpecificOS;
      }
      else {
        if (uVar1 < 0xff00) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
          poVar6 = std::operator<<((ostream *)&e,"Unknown ELF file type ");
          std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
          std::__cxx11::stringbuf::str();
          cmELFInternal::SetErrorMessage(&this->super_cmELFInternal,local_1b8[0]);
          std::__cxx11::string::~string((string *)local_1b8);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
          return;
        }
        FVar7 = FileTypeSpecificProc;
      }
    }
    (this->super_cmELFInternal).ELFType = FVar7;
    (this->super_cmELFInternal).Machine = (this->ELFHeader).e_machine;
    iVar2 = *(int *)&(this->ELFHeader).e_shnum;
    std::vector<Elf64_Shdr,_std::allocator<Elf64_Shdr>_>::resize
              (&this->SectionHeaders,(ulong)(iVar2 + (uint)((short)iVar2 == 0) & 0xffff));
    LoadSectionHeader(this,0);
    uVar4 = (*(this->super_cmELFInternal)._vptr_cmELFInternal[2])(this);
    std::vector<Elf64_Shdr,_std::allocator<Elf64_Shdr>_>::resize(&this->SectionHeaders,(ulong)uVar4)
    ;
    uVar4 = 1;
    do {
      uVar5 = (*(this->super_cmELFInternal)._vptr_cmELFInternal[2])(this);
      if (uVar5 <= uVar4) {
        return;
      }
      bVar3 = LoadSectionHeader(this,uVar4);
      uVar4 = uVar4 + 1;
    } while (bVar3);
    cmELFInternal::SetErrorMessage(&this->super_cmELFInternal,"Failed to load section headers.");
  }
  else {
    msg = "Failed to read main ELF header.";
LAB_0048c723:
    cmELFInternal::SetErrorMessage(&this->super_cmELFInternal,msg);
  }
  return;
}

Assistant:

cmELFInternalImpl<Types>::cmELFInternalImpl(cmELF* external,
                                            std::unique_ptr<std::istream> fin,
                                            ByteOrderType order)
  : cmELFInternal(external, std::move(fin), order)
{
  // Read the main header.
  if (!this->Read(this->ELFHeader)) {
    this->SetErrorMessage("Failed to read main ELF header.");
    return;
  }

  // Determine the ELF file type.
  switch (this->ELFHeader.e_type) {
    case ET_NONE:
      this->SetErrorMessage("ELF file type is NONE.");
      return;
    case ET_REL:
      this->ELFType = cmELF::FileTypeRelocatableObject;
      break;
    case ET_EXEC:
      this->ELFType = cmELF::FileTypeExecutable;
      break;
    case ET_DYN:
      this->ELFType = cmELF::FileTypeSharedLibrary;
      break;
    case ET_CORE:
      this->ELFType = cmELF::FileTypeCore;
      break;
    default: {
      unsigned int eti = static_cast<unsigned int>(this->ELFHeader.e_type);
      if (eti >= ET_LOOS && eti <= ET_HIOS) {
        this->ELFType = cmELF::FileTypeSpecificOS;
        break;
      }
      if (eti >= ET_LOPROC && eti <= ET_HIPROC) {
        this->ELFType = cmELF::FileTypeSpecificProc;
        break;
      }
      std::ostringstream e;
      e << "Unknown ELF file type " << eti;
      this->SetErrorMessage(e.str().c_str());
      return;
    }
  }

  this->Machine = this->ELFHeader.e_machine;

  // Load the section headers.
  this->SectionHeaders.resize(
    this->ELFHeader.e_shnum == 0 ? 1 : this->ELFHeader.e_shnum);
  this->LoadSectionHeader(0);
  this->SectionHeaders.resize(this->GetNumberOfSections());
  for (unsigned int i = 1; i < this->GetNumberOfSections(); ++i) {
    if (!this->LoadSectionHeader(i)) {
      this->SetErrorMessage("Failed to load section headers.");
      return;
    }
  }
}